

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void duckdb_snappy::MemCopy64(char *dst,void *src,size_t size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *src;
  uVar2 = *(undefined8 *)((long)src + 8);
  uVar3 = *(undefined8 *)((long)src + 0x18);
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)((long)src + 0x10);
  *(undefined8 *)(dst + 0x18) = uVar3;
  *(undefined8 *)dst = uVar1;
  *(undefined8 *)(dst + 8) = uVar2;
  if (size < 0x21) {
    return;
  }
  uVar1 = *(undefined8 *)((long)src + 0x20);
  uVar2 = *(undefined8 *)((long)src + 0x28);
  uVar3 = *(undefined8 *)((long)src + 0x38);
  *(undefined8 *)(dst + 0x30) = *(undefined8 *)((long)src + 0x30);
  *(undefined8 *)(dst + 0x38) = uVar3;
  *(undefined8 *)(dst + 0x20) = uVar1;
  *(undefined8 *)(dst + 0x28) = uVar2;
  return;
}

Assistant:

void MemCopy64(char* dst, const void* src, size_t size) {
  // Always copy this many bytes.  If that's below size then copy the full 64.
  constexpr int kShortMemCopy = 32;

  assert(size <= 64);
  assert(std::less_equal<const void*>()(static_cast<const char*>(src) + size,
                                        dst) ||
         std::less_equal<const void*>()(dst + size, src));

  // We know that src and dst are at least size bytes apart. However, because we
  // might copy more than size bytes the copy still might overlap past size.
  // E.g. if src and dst appear consecutively in memory (src + size >= dst).
  // TODO: Investigate wider copies on other platforms.
#if defined(__x86_64__) && defined(__AVX__)
  assert(kShortMemCopy <= 32);
  __m256i data = _mm256_lddqu_si256(static_cast<const __m256i *>(src));
  _mm256_storeu_si256(reinterpret_cast<__m256i *>(dst), data);
  // Profiling shows that nearly all copies are short.
  if (SNAPPY_PREDICT_FALSE(size > kShortMemCopy)) {
    data = _mm256_lddqu_si256(static_cast<const __m256i *>(src) + 1);
    _mm256_storeu_si256(reinterpret_cast<__m256i *>(dst) + 1, data);
  }
#else
  std::memmove(dst, src, kShortMemCopy);
  // Profiling shows that nearly all copies are short.
  if (SNAPPY_PREDICT_FALSE(size > kShortMemCopy)) {
    std::memmove(dst + kShortMemCopy,
                 static_cast<const uint8_t*>(src) + kShortMemCopy,
                 64 - kShortMemCopy);
  }
#endif
}